

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool TimeFunctionParallel(TimeResults *results,function<bool_()> *func)

{
  pointer *this;
  bool bVar1;
  uint32_t uVar2;
  size_type __n;
  reference pTVar3;
  ThreadResult *pair;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ThreadResult,_std::allocator<ThreadResult>_> *__range1_1;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  Latch *local_130;
  vector<ThreadResult,_std::allocator<ThreadResult>_> *local_128;
  function<bool_()> *local_120;
  uint32_t *local_118;
  int local_10c;
  undefined1 local_108 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Latch latch;
  undefined1 local_88 [8];
  vector<ThreadResult,_std::allocator<ThreadResult>_> thread_results;
  uint32_t local_50 [2];
  uint32_t iterations_between_time_checks;
  function<bool_()> local_40;
  function<bool_()> *local_20;
  function<bool_()> *func_local;
  TimeResults *results_local;
  
  local_20 = func;
  func_local = (function<bool_()> *)results;
  if (g_threads < 2) {
    std::function<bool_()>::function(&local_40,func);
    results_local._7_1_ = TimeFunction(results,&local_40);
    std::function<bool_()>::~function(&local_40);
  }
  else {
    this = &thread_results.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::function<bool_()>::function((function<bool_()> *)this,func);
    uVar2 = IterationsBetweenTimeChecks((function<bool_()> *)this);
    std::function<bool_()>::~function
              ((function<bool_()> *)
               &thread_results.super__Vector_base<ThreadResult,_std::allocator<ThreadResult>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar2 == 0) {
      results_local._7_1_ = 0;
    }
    else {
      __n = (size_type)g_threads;
      local_50[0] = uVar2;
      std::allocator<ThreadResult>::allocator((allocator<ThreadResult> *)&latch.field_0x5f);
      std::vector<ThreadResult,_std::allocator<ThreadResult>_>::vector
                ((vector<ThreadResult,_std::allocator<ThreadResult>_> *)local_88,__n,
                 (allocator_type *)&latch.field_0x5f);
      std::allocator<ThreadResult>::~allocator((allocator<ThreadResult> *)&latch.field_0x5f);
      Latch::Latch((Latch *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,g_threads);
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
      for (local_10c = 0; local_10c < g_threads; local_10c = local_10c + 1) {
        __range1._0_4_ = local_10c;
        local_130 = (Latch *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_128 = (vector<ThreadResult,_std::allocator<ThreadResult>_> *)local_88;
        local_118 = local_50;
        local_120 = func;
        std::vector<std::thread,std::allocator<std::thread>>::
        emplace_back<TimeFunctionParallel(TimeResults*,std::function<bool()>)::__0>
                  ((vector<std::thread,std::allocator<std::thread>> *)local_108,(type *)&__range1);
      }
      __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
      thread = (thread *)
               std::vector<std::thread,_std::allocator<std::thread>_>::end
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                    *)&thread);
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator*(&__end1);
        std::thread::join();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&__end1);
      }
      *(undefined8 *)&(func_local->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(func_local->super__Function_base)._M_functor + 8) = 0;
      __end1_1 = std::vector<ThreadResult,_std::allocator<ThreadResult>_>::begin
                           ((vector<ThreadResult,_std::allocator<ThreadResult>_> *)local_88);
      pair = (ThreadResult *)
             std::vector<ThreadResult,_std::allocator<ThreadResult>_>::end
                       ((vector<ThreadResult,_std::allocator<ThreadResult>_> *)local_88);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<ThreadResult_*,_std::vector<ThreadResult,_std::allocator<ThreadResult>_>_>
                            *)&pair);
        if (!bVar1) break;
        pTVar3 = __gnu_cxx::
                 __normal_iterator<ThreadResult_*,_std::vector<ThreadResult,_std::allocator<ThreadResult>_>_>
                 ::operator*(&__end1_1);
        if ((pTVar3->ok & 1U) == 0) {
          results_local._7_1_ = 0;
          goto LAB_0013f641;
        }
        *(uint64_t *)&(func_local->super__Function_base)._M_functor =
             (pTVar3->time_result).num_calls +
             *(long *)&(func_local->super__Function_base)._M_functor;
        *(uint64_t *)((long)&(func_local->super__Function_base)._M_functor + 8) =
             (pTVar3->time_result).us +
             *(long *)((long)&(func_local->super__Function_base)._M_functor + 8);
        __gnu_cxx::
        __normal_iterator<ThreadResult_*,_std::vector<ThreadResult,_std::allocator<ThreadResult>_>_>
        ::operator++(&__end1_1);
      }
      results_local._7_1_ = 1;
LAB_0013f641:
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_108);
      Latch::~Latch((Latch *)&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<ThreadResult,_std::allocator<ThreadResult>_>::~vector
                ((vector<ThreadResult,_std::allocator<ThreadResult>_> *)local_88);
    }
  }
  return (bool)(results_local._7_1_ & 1);
}

Assistant:

static bool TimeFunctionParallel(TimeResults *results,
                                 std::function<bool()> func) {
  if (g_threads <= 1) {
    return TimeFunction(results, std::move(func));
  }

  uint32_t iterations_between_time_checks = IterationsBetweenTimeChecks(func);
  if (iterations_between_time_checks == 0) {
    return false;
  }

  struct ThreadResult {
    TimeResults time_result;
    bool ok = false;
  };
  std::vector<ThreadResult> thread_results(g_threads);
  Latch latch(g_threads);
  std::vector<std::thread> threads;
  for (int i = 0; i < g_threads; i++) {
    threads.emplace_back([&, i] {
      // Wait for all the threads to be ready before running the benchmark.
      latch.ArriveAndWait();
      thread_results[i].ok = TimeFunctionImpl(
          &thread_results[i].time_result, func, iterations_between_time_checks);
    });
  }

  for (auto &thread : threads) {
    thread.join();
  }

  results->num_calls = 0;
  results->us = 0;
  for (const auto &pair : thread_results) {
    if (!pair.ok) {
      return false;
    }
    results->num_calls += pair.time_result.num_calls;
    results->us += pair.time_result.us;
  }
  return true;
}